

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maybe.hpp
# Opt level: O2

maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void> *
__thiscall
pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
::operator=(maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
            *this,maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                  *other)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *other_00;
  
  if (other != this) {
    if (other->valid_ == false) {
      reset(this);
    }
    else {
      other_00 = maybe<std::__cxx11::string,void>::
                 value_impl<pstore::maybe<std::__cxx11::string,void>&,std::__cxx11::string>(other);
      maybe<std::__cxx11::string,void>::operator=((maybe<std::__cxx11::string,void> *)this,other_00)
      ;
    }
  }
  return this;
}

Assistant:

maybe &
        operator= (maybe && other) noexcept (std::is_nothrow_move_assignable<T>::value &&
                                                 std::is_nothrow_move_constructible<T>::value) {

            if (&other != this) {
                if (!other.has_value ()) {
                    this->reset ();
                } else {
                    this->operator= (std::forward<T> (other.value ()));
                }
            }
            return *this;
        }